

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_psbt.cpp
# Opt level: O3

void __thiscall Psbt_EmptyObject_Test::TestBody(Psbt_EmptyObject_Test *this)

{
  vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *pvVar1;
  bool bVar2;
  char *pcVar3;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  Psbt empty_obj;
  AssertHelper local_108;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  ByteData local_f8;
  Transaction local_e0;
  uint local_9c;
  Psbt local_98;
  
  cfd::Psbt::Psbt(&local_98);
  local_108.data_._0_4_ = 2;
  cfd::core::Psbt::GetTransaction(&local_e0,&local_98.super_Psbt);
  local_9c = cfd::core::AbstractTransaction::GetVersion(&local_e0.super_AbstractTransaction);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_f8,"2","empty_obj.GetTransaction().GetVersion()",(int *)&local_108,
             (int *)&local_9c);
  cfd::core::Transaction::~Transaction(&local_e0);
  if (local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if (local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_f8.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x227,pcVar3);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_e0.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_e0.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0)) {
        (**(code **)(*local_e0.super_AbstractTransaction._vptr_AbstractTransaction + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_108.data_._0_4_ = 0;
  cfd::core::Psbt::GetTransaction(&local_e0,&local_98.super_Psbt);
  local_9c = cfd::core::AbstractTransaction::GetLockTime(&local_e0.super_AbstractTransaction);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_f8,"0","empty_obj.GetTransaction().GetLockTime()",(int *)&local_108,
             &local_9c);
  cfd::core::Transaction::~Transaction(&local_e0);
  if (local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if (local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_f8.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x228,pcVar3);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_e0.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_e0.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0)) {
        (**(code **)(*local_e0.super_AbstractTransaction._vptr_AbstractTransaction + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x13;
  local_108.data_._0_4_ = cfd::core::Psbt::GetDataSize(&local_98.super_Psbt);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_e0,"19","empty_obj.GetDataSize()",(int *)&local_f8,
             (uint *)&local_108);
  if ((char)local_e0.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&local_f8);
    if ((undefined8 *)local_e0.super_AbstractTransaction.wally_tx_pointer_ == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *local_e0.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x229,pcVar3);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (CONCAT44(local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                 local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_f8.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           local_f8.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_f8.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_f8.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_e0.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::GetData(&local_f8,&local_98.super_Psbt);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&local_e0,&local_f8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_108,"\"70736274ff01000a0200000000000000000000\"",
             "empty_obj.GetData().GetHex().c_str()","70736274ff01000a0200000000000000000000",
             (char *)local_e0.super_AbstractTransaction._vptr_AbstractTransaction);
  if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
      local_e0.super_AbstractTransaction._vptr_AbstractTransaction != &local_e0.vin_) {
    operator_delete(local_e0.super_AbstractTransaction._vptr_AbstractTransaction);
  }
  if ((void *)CONCAT44(local_f8.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_f8.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_f8.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_f8.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_));
  }
  if (local_108.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if (local_100.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_100.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x22b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    if (local_e0.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_e0.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0)) {
        (**(code **)(*local_e0.super_AbstractTransaction._vptr_AbstractTransaction + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_100,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::GetBase64_abi_cxx11_((string *)&local_e0,&local_98.super_Psbt);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_f8,"\"cHNidP8BAAoCAAAAAAAAAAAAAA==\"",
             "empty_obj.GetBase64().c_str()","cHNidP8BAAoCAAAAAAAAAAAAAA==",
             (char *)local_e0.super_AbstractTransaction._vptr_AbstractTransaction);
  if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
      local_e0.super_AbstractTransaction._vptr_AbstractTransaction != &local_e0.vin_) {
    operator_delete(local_e0.super_AbstractTransaction._vptr_AbstractTransaction);
  }
  if (local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if (local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_f8.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x22c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_e0.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_e0.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0)) {
        (**(code **)(*local_e0.super_AbstractTransaction._vptr_AbstractTransaction + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_98.super_Psbt._vptr_Psbt = (_func_int **)&PTR__Psbt_00727790;
  std::
  _Rb_tree<cfd::core::OutPoint,_cfd::core::OutPoint,_std::_Identity<cfd::core::OutPoint>,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
  ::~_Rb_tree(&local_98.verify_ignore_map_._M_t);
  cfd::core::Psbt::~Psbt(&local_98.super_Psbt);
  cfd::Psbt::Psbt(&local_98,1,100);
  local_108.data_._0_4_ = 1;
  cfd::core::Psbt::GetTransaction(&local_e0,&local_98.super_Psbt);
  local_9c = cfd::core::AbstractTransaction::GetVersion(&local_e0.super_AbstractTransaction);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_f8,"1","obj.GetTransaction().GetVersion()",(int *)&local_108,
             (int *)&local_9c);
  cfd::core::Transaction::~Transaction(&local_e0);
  if (local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if (local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_f8.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x233,pcVar3);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_e0.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_e0.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0)) {
        (**(code **)(*local_e0.super_AbstractTransaction._vptr_AbstractTransaction + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_108.data_._0_4_ = 100;
  cfd::core::Psbt::GetTransaction(&local_e0,&local_98.super_Psbt);
  local_9c = cfd::core::AbstractTransaction::GetLockTime(&local_e0.super_AbstractTransaction);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_f8,"100","obj.GetTransaction().GetLockTime()",(int *)&local_108,
             &local_9c);
  cfd::core::Transaction::~Transaction(&local_e0);
  if (local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if (local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_f8.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x234,pcVar3);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_e0.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_e0.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0)) {
        (**(code **)(*local_e0.super_AbstractTransaction._vptr_AbstractTransaction + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x13;
  local_108.data_._0_4_ = cfd::core::Psbt::GetDataSize(&local_98.super_Psbt);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_e0,"19","obj.GetDataSize()",(int *)&local_f8,(uint *)&local_108);
  if ((char)local_e0.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&local_f8);
    if ((undefined8 *)local_e0.super_AbstractTransaction.wally_tx_pointer_ == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *local_e0.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x235,pcVar3);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (CONCAT44(local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                 local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_f8.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           local_f8.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_f8.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_f8.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_e0.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::GetData(&local_f8,&local_98.super_Psbt);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&local_e0,&local_f8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_108,"\"70736274ff01000a0100000000006400000000\"",
             "obj.GetData().GetHex().c_str()","70736274ff01000a0100000000006400000000",
             (char *)local_e0.super_AbstractTransaction._vptr_AbstractTransaction);
  if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
      local_e0.super_AbstractTransaction._vptr_AbstractTransaction != &local_e0.vin_) {
    operator_delete(local_e0.super_AbstractTransaction._vptr_AbstractTransaction);
  }
  if ((void *)CONCAT44(local_f8.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_f8.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_f8.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_f8.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_));
  }
  if (local_108.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if (local_100.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_100.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x237,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    if (local_e0.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_e0.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0)) {
        (**(code **)(*local_e0.super_AbstractTransaction._vptr_AbstractTransaction + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_100,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::GetBase64_abi_cxx11_((string *)&local_e0,&local_98.super_Psbt);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_f8,"\"cHNidP8BAAoBAAAAAABkAAAAAA==\"","obj.GetBase64().c_str()",
             "cHNidP8BAAoBAAAAAABkAAAAAA==",
             (char *)local_e0.super_AbstractTransaction._vptr_AbstractTransaction);
  if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
      local_e0.super_AbstractTransaction._vptr_AbstractTransaction != &local_e0.vin_) {
    operator_delete(local_e0.super_AbstractTransaction._vptr_AbstractTransaction);
  }
  if (local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if (local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_f8.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x238,pcVar3);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_e0.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_e0.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0)) {
        (**(code **)(*local_e0.super_AbstractTransaction._vptr_AbstractTransaction + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_98.super_Psbt._vptr_Psbt = (_func_int **)&PTR__Psbt_00727790;
  std::
  _Rb_tree<cfd::core::OutPoint,_cfd::core::OutPoint,_std::_Identity<cfd::core::OutPoint>,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
  ::~_Rb_tree(&local_98.verify_ignore_map_._M_t);
  cfd::core::Psbt::~Psbt(&local_98.super_Psbt);
  pvVar1 = &local_e0.vin_;
  local_e0.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)pvVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,"cHNidP8BAAoBAAAAAABkAAAAAA==","");
  cfd::Psbt::Psbt(&local_98,(string *)&local_e0);
  if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
      local_e0.super_AbstractTransaction._vptr_AbstractTransaction != pvVar1) {
    operator_delete(local_e0.super_AbstractTransaction._vptr_AbstractTransaction);
  }
  local_108.data_._0_4_ = 1;
  cfd::core::Psbt::GetTransaction(&local_e0,&local_98.super_Psbt);
  local_9c = cfd::core::AbstractTransaction::GetVersion(&local_e0.super_AbstractTransaction);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_f8,"1","from_b64.GetTransaction().GetVersion()",(int *)&local_108,
             (int *)&local_9c);
  cfd::core::Transaction::~Transaction(&local_e0);
  if (local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if (local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_f8.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x23f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
        local_e0.super_AbstractTransaction._vptr_AbstractTransaction !=
        (vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
          local_e0.super_AbstractTransaction._vptr_AbstractTransaction !=
          (vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)0x0)) {
        (*(code *)(((((_Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
                     local_e0.super_AbstractTransaction._vptr_AbstractTransaction)->_M_impl).
                    super__Vector_impl_data._M_start)->super_AbstractTxIn).txid_._vptr_Txid)();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_108.data_._0_4_ = 100;
  cfd::core::Psbt::GetTransaction(&local_e0,&local_98.super_Psbt);
  local_9c = cfd::core::AbstractTransaction::GetLockTime(&local_e0.super_AbstractTransaction);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_f8,"100","from_b64.GetTransaction().GetLockTime()",(int *)&local_108
             ,&local_9c);
  cfd::core::Transaction::~Transaction(&local_e0);
  if (local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if (local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_f8.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x240,pcVar3);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
        local_e0.super_AbstractTransaction._vptr_AbstractTransaction !=
        (vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
          local_e0.super_AbstractTransaction._vptr_AbstractTransaction !=
          (vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)0x0)) {
        (*(code *)(((((_Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
                     local_e0.super_AbstractTransaction._vptr_AbstractTransaction)->_M_impl).
                    super__Vector_impl_data._M_start)->super_AbstractTxIn).txid_._vptr_Txid)();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x13;
  local_108.data_._0_4_ = cfd::core::Psbt::GetDataSize(&local_98.super_Psbt);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_e0,"19","from_b64.GetDataSize()",(int *)&local_f8,(uint *)&local_108
            );
  if ((char)local_e0.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&local_f8);
    if ((undefined8 *)local_e0.super_AbstractTransaction.wally_tx_pointer_ == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *local_e0.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x241,pcVar3);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (CONCAT44(local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                 local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_f8.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           local_f8.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_f8.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_f8.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_e0.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::GetData(&local_f8,&local_98.super_Psbt);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&local_e0,&local_f8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_108,"\"70736274ff01000a0100000000006400000000\"",
             "from_b64.GetData().GetHex().c_str()","70736274ff01000a0100000000006400000000",
             (char *)local_e0.super_AbstractTransaction._vptr_AbstractTransaction);
  if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
      local_e0.super_AbstractTransaction._vptr_AbstractTransaction != pvVar1) {
    operator_delete(local_e0.super_AbstractTransaction._vptr_AbstractTransaction);
  }
  if ((void *)CONCAT44(local_f8.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_f8.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_f8.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_f8.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_));
  }
  if (local_108.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if (local_100.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_100.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x243,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
        local_e0.super_AbstractTransaction._vptr_AbstractTransaction !=
        (vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
          local_e0.super_AbstractTransaction._vptr_AbstractTransaction !=
          (vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)0x0)) {
        (*(code *)(((((_Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
                     local_e0.super_AbstractTransaction._vptr_AbstractTransaction)->_M_impl).
                    super__Vector_impl_data._M_start)->super_AbstractTxIn).txid_._vptr_Txid)();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_100,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::GetBase64_abi_cxx11_((string *)&local_e0,&local_98.super_Psbt);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_f8,"\"cHNidP8BAAoBAAAAAABkAAAAAA==\"","from_b64.GetBase64().c_str()"
             ,"cHNidP8BAAoBAAAAAABkAAAAAA==",
             (char *)local_e0.super_AbstractTransaction._vptr_AbstractTransaction);
  if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
      local_e0.super_AbstractTransaction._vptr_AbstractTransaction != pvVar1) {
    operator_delete(local_e0.super_AbstractTransaction._vptr_AbstractTransaction);
  }
  if (local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if (local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_f8.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x244,pcVar3);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
        local_e0.super_AbstractTransaction._vptr_AbstractTransaction !=
        (vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
          local_e0.super_AbstractTransaction._vptr_AbstractTransaction !=
          (vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)0x0)) {
        (*(code *)(((((_Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
                     local_e0.super_AbstractTransaction._vptr_AbstractTransaction)->_M_impl).
                    super__Vector_impl_data._M_start)->super_AbstractTxIn).txid_._vptr_Txid)();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_98.super_Psbt._vptr_Psbt = (_func_int **)&PTR__Psbt_00727790;
  std::
  _Rb_tree<cfd::core::OutPoint,_cfd::core::OutPoint,_std::_Identity<cfd::core::OutPoint>,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
  ::~_Rb_tree(&local_98.verify_ignore_map_._M_t);
  cfd::core::Psbt::~Psbt(&local_98.super_Psbt);
  return;
}

Assistant:

TEST(Psbt, EmptyObject) {
  try {
    Psbt empty_obj;
    EXPECT_EQ(2, empty_obj.GetTransaction().GetVersion());
    EXPECT_EQ(0, empty_obj.GetTransaction().GetLockTime());
    EXPECT_EQ(19, empty_obj.GetDataSize());
    EXPECT_STREQ("70736274ff01000a0200000000000000000000",
        empty_obj.GetData().GetHex().c_str());
    EXPECT_STREQ("cHNidP8BAAoCAAAAAAAAAAAAAA==", empty_obj.GetBase64().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  try {
    Psbt obj(1, 100);
    EXPECT_EQ(1, obj.GetTransaction().GetVersion());
    EXPECT_EQ(100, obj.GetTransaction().GetLockTime());
    EXPECT_EQ(19, obj.GetDataSize());
    EXPECT_STREQ("70736274ff01000a0100000000006400000000",
        obj.GetData().GetHex().c_str());
    EXPECT_STREQ("cHNidP8BAAoBAAAAAABkAAAAAA==", obj.GetBase64().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  try {
    Psbt from_b64("cHNidP8BAAoBAAAAAABkAAAAAA==");
    EXPECT_EQ(1, from_b64.GetTransaction().GetVersion());
    EXPECT_EQ(100, from_b64.GetTransaction().GetLockTime());
    EXPECT_EQ(19, from_b64.GetDataSize());
    EXPECT_STREQ("70736274ff01000a0100000000006400000000",
        from_b64.GetData().GetHex().c_str());
    EXPECT_STREQ("cHNidP8BAAoBAAAAAABkAAAAAA==", from_b64.GetBase64().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }
}